

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

Test * ParserTestBrokenInclude::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestBrokenInclude((ParserTestBrokenInclude *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, BrokenInclude) {
  fs_.Create("include.ninja", "build\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("include include.ninja\n", &err));
  EXPECT_EQ("include.ninja:1: expected path\n"
            "build\n"
            "     ^ near here"
            , err);
}